

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnView::selectAll(QColumnView *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  QItemSelectionModel *pQVar5;
  QAbstractItemModel *pQVar6;
  long in_FS_OFFSET;
  QItemSelectionRange QStack_e8;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  QModelIndex local_b8;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QModelIndex local_78;
  QArrayData *local_58;
  undefined8 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar4 != (QAbstractItemModel *)0x0) {
    pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
    if (pQVar5 != (QItemSelectionModel *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::selectionModel((QAbstractItemView *)this);
      QItemSelectionModel::selectedIndexes();
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex(&local_78,(QAbstractItemView *)this);
      local_98.d = (Data *)0x0;
      local_98.ptr = (QItemSelectionRange *)0x0;
      local_98.size = 0;
      if (local_48 != (undefined1 *)0x0) {
        if ((long *)puStack_50[2] == (long *)0x0) {
          local_b8._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
          local_b8.i = 0;
          local_b8.m.ptr = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)puStack_50[2] + 0x68))(&local_b8);
        }
        local_78.m.ptr = local_b8.m.ptr;
        local_78.r = local_b8.r;
        local_78.c = local_b8.c;
        local_78.i = local_b8.i;
      }
      if (local_48 == (undefined1 *)0x1) {
        local_78._0_8_ = *puStack_50;
        local_78.i = puStack_50[1];
        local_78.m.ptr = (QAbstractItemModel *)puStack_50[2];
        pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
        cVar1 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,&local_78);
        if (cVar1 == '\0') {
          if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
            local_b8._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
            local_b8.i = 0;
            local_b8.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_78.m.ptr + 0x68))(&local_b8,local_78.m.ptr,&local_78);
          }
          local_78.m.ptr = local_b8.m.ptr;
          local_78.r = local_b8.r;
          local_78.c = local_b8.c;
          local_78.i = local_b8.i;
        }
        else {
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8,&local_78)
          ;
          QPersistentModelIndex::QPersistentModelIndex
                    ((QPersistentModelIndex *)&local_b8.i,&local_78);
          QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                    ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                     (QItemSelectionRange *)&local_b8);
          QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8.i);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
        }
      }
      local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar4 + 0x60))(&local_b8,pQVar4,0,0,&local_78);
      local_c8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      pQVar6 = QAbstractItemView::model((QAbstractItemView *)this);
      iVar2 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,&local_78);
      pQVar6 = QAbstractItemView::model((QAbstractItemView *)this);
      iVar3 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_78);
      (**(code **)(*(long *)pQVar4 + 0x60))
                ((QModelIndex *)&local_d8,pQVar4,iVar2 + -1,iVar3 + -1,&local_78);
      QPersistentModelIndex::QPersistentModelIndex(&QStack_e8.tl,&local_b8);
      QPersistentModelIndex::QPersistentModelIndex(&QStack_e8.br,(QModelIndex *)&local_d8);
      QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,&QStack_e8);
      QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
      QPersistentModelIndex::~QPersistentModelIndex(&QStack_e8.br);
      QPersistentModelIndex::~QPersistentModelIndex(&QStack_e8.tl);
      pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5,&local_98,3);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,0x18,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::selectAll()
{
    if (!model() || !selectionModel())
        return;

    QModelIndexList indexList = selectionModel()->selectedIndexes();
    QModelIndex parent = rootIndex();
    QItemSelection selection;
    if (indexList.size() >= 1)
        parent = indexList.at(0).parent();
    if (indexList.size() == 1) {
        parent = indexList.at(0);
        if (!model()->hasChildren(parent))
            parent = parent.parent();
        else
            selection.append(QItemSelectionRange(parent, parent));
    }

    QModelIndex tl = model()->index(0, 0, parent);
    QModelIndex br = model()->index(model()->rowCount(parent) - 1,
                                    model()->columnCount(parent) - 1,
                                    parent);
    selection.append(QItemSelectionRange(tl, br));
    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}